

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall
QTableWidget::setHorizontalHeaderItem(QTableWidget *this,int column,QTableWidgetItem *item)

{
  QTableWidgetPrivate *this_00;
  QTableModel *this_01;
  QTableWidgetItem *pQVar1;
  
  if (item != (QTableWidgetItem *)0x0) {
    this_00 = *(QTableWidgetPrivate **)
               &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                super_QFrame.super_QWidget.field_0x8;
    item->view = this;
    this_01 = QTableWidgetPrivate::tableModel(this_00);
    QTableModel::setHorizontalHeaderItem(this_01,column,item);
    return;
  }
  pQVar1 = takeHorizontalHeaderItem(this,column);
  if (pQVar1 != (QTableWidgetItem *)0x0) {
    (*pQVar1->_vptr_QTableWidgetItem[1])(pQVar1);
    return;
  }
  return;
}

Assistant:

void QTableWidget::setHorizontalHeaderItem(int column, QTableWidgetItem *item)
{
    Q_D(QTableWidget);
    if (item) {
        item->view = this;
        d->tableModel()->setHorizontalHeaderItem(column, item);
    } else {
        delete takeHorizontalHeaderItem(column);
    }
}